

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

uint capnp::schema::operator*(uint param_1)

{
  uint uVar1;
  
  uVar1 = param_1 * 0x8000 + ~param_1;
  uVar1 = (uVar1 >> 0xc ^ uVar1) * 5;
  uVar1 = (uVar1 >> 4 ^ uVar1) * 0x809;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

inline uint intHash32(uint32_t i) {
  // Basic 32-bit integer hash function.
  //
  // This hash function needs to have a uniform distribution, such that changing any bits in the
  // input tends to randomly change ~half the bits in the output. In particular, it is important
  // that a change to the high bits of the input will affect the low bits of the output, so that
  // even if we truncate the high bits of the output, the lower bits still have a uniform
  // distribution.
  //
  // The point of all this is that kj::HashMap uses power-of-two-sized tables, and we want to make
  // sure maps with integer keys hash well into those tables.

  // On architectures with a hardware CRC32 instruction, use it. Otherwise fall back to a
  // reasonable shifty hash.
#if __CRC32__
  return __builtin_ia32_crc32si(0, i);
#elif __ARM_FEATURE_CRC32
  return __builtin_arm_crc32w(0, i);
#else
  // Thomas Wang 32 bit integer hash function from https://gist.github.com/badboy/6267743
  // This page says it's public domain: http://burtleburtle.net/bob/hash/integer.html
  i = ~i + (i << 15); // i = (i << 15) - i - 1;
  i = i ^ (i >> 12);
  i = i + (i << 2);
  i = i ^ (i >> 4);
  i = i * 2057; // i = (i + (i << 3)) + (i << 11);
  i = i ^ (i >> 16);
  return i;
#endif
}